

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O1

double calc_action(double *x,double (*A) [3])

{
  int idim;
  long lVar1;
  double (*padVar2) [3];
  long lVar3;
  double dVar4;
  
  dVar4 = 0.0;
  lVar1 = 0;
  padVar2 = A;
  do {
    if (lVar1 != 0) {
      lVar3 = 0;
      do {
        dVar4 = dVar4 + (*padVar2)[lVar3] * x[lVar1] * x[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    dVar4 = x[lVar1] * 0.5 * *(double *)((long)A + lVar1 * 0x20) * x[lVar1] + dVar4;
    lVar1 = lVar1 + 1;
    padVar2 = padVar2 + 1;
  } while (lVar1 != 3);
  return dVar4;
}

Assistant:

double calc_action(const double x[ndim], const double A[ndim][ndim]) {
    double action = 0e0;
    for (int idim = 0; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            action += x[idim] * A[idim][jdim] * x[jdim];
        }
        action += 0.5e0 * x[idim] * A[idim][idim] * x[idim];
    }
    return action;
}